

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall
OptionRecordInt::OptionRecordInt
          (OptionRecordInt *this,string *Xname,string *Xdescription,bool Xadvanced,
          HighsInt *Xvalue_pointer,HighsInt Xlower_bound,HighsInt Xdefault_value,
          HighsInt Xupper_bound)

{
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)Xname);
  std::__cxx11::string::string((string *)&sStack_68,(string *)Xdescription);
  OptionRecord::OptionRecord(&this->super_OptionRecord,kInt,&local_48,&sStack_68,Xadvanced);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecord_0014e658;
  this->value = Xvalue_pointer;
  this->lower_bound = Xlower_bound;
  this->default_value = Xdefault_value;
  this->upper_bound = Xupper_bound;
  *Xvalue_pointer = Xdefault_value;
  return;
}

Assistant:

OptionRecordInt(std::string Xname, std::string Xdescription, bool Xadvanced,
                  HighsInt* Xvalue_pointer, HighsInt Xlower_bound,
                  HighsInt Xdefault_value, HighsInt Xupper_bound)
      : OptionRecord(HighsOptionType::kInt, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    lower_bound = Xlower_bound;
    default_value = Xdefault_value;
    upper_bound = Xupper_bound;
    *value = default_value;
  }